

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::session_impl::set_external_address
          (session_impl *this,shared_ptr<libtorrent::aux::listen_socket_t> *sock,address *ip,
          ip_source_t source_type,address *source)

{
  element_type *peVar1;
  size_type sVar2;
  pointer pcVar3;
  pointer psVar4;
  dht_tracker *this_00;
  bool bVar5;
  address *ep;
  address *extraout_RDX;
  address *addr;
  address *addr_00;
  string *__return_storage_ptr__;
  shared_ptr<libtorrent::aux::torrent> *t;
  pointer psVar6;
  string local_a0;
  __shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2> local_80;
  string local_70;
  string local_50;
  
  bVar5 = ip_voter::cast_vote(&((sock->
                                super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                                )._M_ptr)->external_address,ip,source_type,source);
  if (bVar5) {
    if (((this->m_alerts).m_alert_mask._M_i.m_val >> 0xd & 1) != 0) {
      peVar1 = (sock->
               super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      sVar2 = (peVar1->device)._M_string_length;
      if (sVar2 == 0) {
        __return_storage_ptr__ = &local_70;
        print_endpoint_abi_cxx11_
                  (__return_storage_ptr__,(aux *)&peVar1->local_endpoint,(endpoint *)ep);
        addr = extraout_RDX;
      }
      else {
        __return_storage_ptr__ = &peVar1->device;
        addr = ep;
      }
      pcVar3 = (__return_storage_ptr__->_M_dataplus)._M_p;
      print_address_abi_cxx11_(&local_a0,(aux *)ip,addr);
      print_address_abi_cxx11_(&local_50,(aux *)source,addr_00);
      session_log(this,"external address updated for %s [ new-ip: %s type: %d last-voter: %s ]",
                  pcVar3,local_a0._M_dataplus._M_p,(ulong)source_type.m_val,
                  local_50._M_dataplus._M_p);
      ::std::__cxx11::string::~string((string *)&local_50);
      ::std::__cxx11::string::~string((string *)&local_a0);
      if (sVar2 == 0) {
        ::std::__cxx11::string::~string((string *)&local_70);
      }
    }
    if (((this->m_alerts).m_alert_mask._M_i.m_val & 0x40) != 0) {
      alert_manager::emplace_alert<libtorrent::external_ip_alert,boost::asio::ip::address_const&>
                (&this->m_alerts,ip);
    }
    psVar4 = (this->m_torrents).m_array.
             super__Vector_base<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (psVar6 = (this->m_torrents).m_array.
                  super__Vector_base<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; psVar6 != psVar4; psVar6 = psVar6 + 1)
    {
      torrent::new_external_ip
                ((psVar6->super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr);
    }
    this_00 = (this->m_dht).
              super___shared_ptr<libtorrent::dht::dht_tracker,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (this_00 != (dht_tracker *)0x0) {
      ::std::__shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr(&local_80,
                   &sock->
                    super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                  );
      ::std::__weak_ptr<libtorrent::aux::listen_socket_t,(__gnu_cxx::_Lock_policy)2>::
      __weak_ptr<libtorrent::aux::listen_socket_t,void>
                ((__weak_ptr<libtorrent::aux::listen_socket_t,(__gnu_cxx::_Lock_policy)2> *)
                 &local_a0,&local_80);
      libtorrent::dht::dht_tracker::update_node_id(this_00,(listen_socket_handle *)&local_a0);
      ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
                ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)&local_a0._M_string_length);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80._M_refcount);
    }
  }
  return;
}

Assistant:

void session_impl::set_external_address(std::shared_ptr<listen_socket_t> const& sock
		, address const& ip, ip_source_t const source_type, address const& source)
	{
		if (!sock->external_address.cast_vote(ip, source_type, source)) return;

#ifndef TORRENT_DISABLE_LOGGING
		if (should_log())
		{
			session_log("external address updated for %s [ new-ip: %s type: %d last-voter: %s ]"
				, sock->device.empty() ? print_endpoint(sock->local_endpoint).c_str() : sock->device.c_str()
				, print_address(ip).c_str()
				, static_cast<std::uint8_t>(source_type)
				, print_address(source).c_str());
		}
#endif

		if (m_alerts.should_post<external_ip_alert>())
			m_alerts.emplace_alert<external_ip_alert>(ip);

		for (auto const& t : m_torrents)
		{
			t->new_external_ip();
		}

		// since we have a new external IP now, we need to
		// restart the DHT with a new node ID

#ifndef TORRENT_DISABLE_DHT
		if (m_dht) m_dht->update_node_id(sock);
#endif
	}